

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O2

uint ppc_hash64_hpte_page_shift_noslb(PowerPCCPU_conflict3 *cpu,uint64_t pte0,uint64_t pte1)

{
  uint uVar1;
  long lVar2;
  
  if ((pte0 & 4) == 0) {
    uVar1 = 0xc;
  }
  else {
    lVar2 = 8;
    do {
      if (lVar2 + 0x48 == 0x290) {
        return 0;
      }
      if (*(int *)((long)(cpu->hash64_opts->sps[0].enc + -2) + lVar2) == 0) {
        return 0;
      }
      uVar1 = hpte_page_shift((PPCHash64SegmentPageSizes *)
                              ((long)(cpu->hash64_opts->sps[0].enc + -2) + lVar2),pte0,pte1);
      lVar2 = lVar2 + 0x48;
    } while (uVar1 == 0);
  }
  return uVar1;
}

Assistant:

unsigned ppc_hash64_hpte_page_shift_noslb(PowerPCCPU *cpu,
                                          uint64_t pte0, uint64_t pte1)
{
    int i;

    if (!(pte0 & HPTE64_V_LARGE)) {
        return 12;
    }

    /*
     * The encodings in env->sps need to be carefully chosen so that
     * this gives an unambiguous result.
     */
    for (i = 0; i < PPC_PAGE_SIZES_MAX_SZ; i++) {
        const PPCHash64SegmentPageSizes *sps = &cpu->hash64_opts->sps[i];
        unsigned shift;

        if (!sps->page_shift) {
            break;
        }

        shift = hpte_page_shift(sps, pte0, pte1);
        if (shift) {
            return shift;
        }
    }

    return 0;
}